

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyModule.cpp
# Opt level: O0

Var Js::WebAssemblyModule::EntryImports(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  uint32 uVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  WebAssemblyModule *this_00;
  WasmImport *pWVar7;
  JavascriptString *newValue;
  JavascriptString *newValue_00;
  JavascriptString *newValue_01;
  Var instance;
  Var pair;
  JavascriptString *name;
  JavascriptString *moduleName;
  JavascriptString *kind;
  WasmImport *import;
  uint32 i;
  Var importArray;
  WebAssemblyModule *module;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x72,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  if (((ulong)scriptContext & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x73,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar4 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyModule.cpp"
                                ,0x76,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (1 < ((uint)scriptContext & 0xffffff)) {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
    bVar2 = VarIs<Js::WebAssemblyModule>(pvVar6);
    if (bVar2) {
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,1);
      this_00 = VarTo<Js::WebAssemblyModule>(pvVar6);
      pvVar6 = Js::JavascriptOperators::NewJavascriptArrayNoArg(pSVar4);
      import._4_4_ = 0;
      while( true ) {
        uVar3 = GetImportCount(this_00);
        if (uVar3 <= import._4_4_) break;
        pWVar7 = GetImport(this_00,import._4_4_);
        newValue = GetExternalKindString(pSVar4,pWVar7->kind);
        newValue_00 = JavascriptString::NewCopySz(pWVar7->modName,pSVar4);
        newValue_01 = JavascriptString::NewCopySz(pWVar7->importName,pSVar4);
        instance = Js::JavascriptOperators::NewJavascriptObjectNoArg(pSVar4);
        Js::JavascriptOperators::OP_SetProperty
                  (instance,0xe7,newValue,pSVar4,(PropertyValueInfo *)0x0,PropertyOperation_None,
                   (Var)0x0);
        Js::JavascriptOperators::OP_SetProperty
                  (instance,0xe5,newValue_00,pSVar4,(PropertyValueInfo *)0x0,PropertyOperation_None,
                   (Var)0x0);
        Js::JavascriptOperators::OP_SetProperty
                  (instance,0x106,newValue_01,pSVar4,(PropertyValueInfo *)0x0,PropertyOperation_None
                   ,(Var)0x0);
        Js::JavascriptArray::Push(pSVar4,pvVar6,instance);
        import._4_4_ = import._4_4_ + 1;
      }
      return pvVar6;
    }
  }
  JavascriptError::ThrowTypeError(pSVar4,-0x7ff5e4a5,(PCWSTR)0x0);
}

Assistant:

Var
WebAssemblyModule::EntryImports(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count < 2 || !VarIs<WebAssemblyModule>(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedModule);
    }

    WebAssemblyModule * module = VarTo<WebAssemblyModule>(args[1]);

    Var importArray = JavascriptOperators::NewJavascriptArrayNoArg(scriptContext);
    for (uint32 i = 0; i < module->GetImportCount(); ++i)
    {
        Wasm::WasmImport * import = module->GetImport(i);
        Js::JavascriptString * kind = GetExternalKindString(scriptContext, import->kind);
        Js::JavascriptString * moduleName = JavascriptString::NewCopySz(import->modName, scriptContext);
        Js::JavascriptString * name = JavascriptString::NewCopySz(import->importName, scriptContext);

        Var pair = JavascriptOperators::NewJavascriptObjectNoArg(scriptContext);
        JavascriptOperators::OP_SetProperty(pair, PropertyIds::kind, kind, scriptContext);
        JavascriptOperators::OP_SetProperty(pair, PropertyIds::module, moduleName, scriptContext);
        JavascriptOperators::OP_SetProperty(pair, PropertyIds::name, name, scriptContext);
        JavascriptArray::Push(scriptContext, importArray, pair);
    }

    return importArray;
}